

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSplitter::ClearFreeMemory(ImDrawListSplitter *this)

{
  ImDrawChannel *__s;
  int *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int i_00;
  
  for (i_00 = 0; i_00 < in_RDI[2]; i_00 = i_00 + 1) {
    if (i_00 == *in_RDI) {
      __s = ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 2),i_00);
      memset(__s,0,0x20);
    }
    ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 2),i_00);
    ImVector<ImDrawCmd>::clear((ImVector<ImDrawCmd> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
    ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 2),i_00);
    ImVector<unsigned_short>::clear
              ((ImVector<unsigned_short> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
  }
  *in_RDI = 0;
  in_RDI[1] = 1;
  ImVector<ImDrawChannel>::clear
            ((ImVector<ImDrawChannel> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void ImDrawListSplitter::ClearFreeMemory()
{
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == _Current)
            memset(&_Channels[i], 0, sizeof(_Channels[i]));  // Current channel is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i]._CmdBuffer.clear();
        _Channels[i]._IdxBuffer.clear();
    }
    _Current = 0;
    _Count = 1;
    _Channels.clear();
}